

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internal_file_server.cpp
# Opt level: O1

bool __thiscall
cppcms::impl::file_server::check_in_document_root(file_server *this,string *normal,string *real)

{
  pointer pcVar1;
  size_type sVar2;
  bool bVar3;
  pointer ppVar4;
  ulong uVar5;
  file_server *this_00;
  ulong uVar6;
  string root;
  undefined1 local_70 [32];
  undefined1 local_50 [32];
  
  normalize_path(normal);
  local_70._0_8_ = local_70 + 0x10;
  pcVar1 = (this->document_root_)._M_dataplus._M_p;
  this_00 = (file_server *)local_70;
  std::__cxx11::string::_M_construct<char*>
            ((string *)this_00,pcVar1,pcVar1 + (this->document_root_)._M_string_length);
  ppVar4 = (this->alias_).
           super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->alias_).
      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish != ppVar4) {
    uVar5 = 0;
    uVar6 = 1;
    do {
      this_00 = (file_server *)(ppVar4 + uVar5);
      bVar3 = is_file_prefix((string *)this_00,normal);
      if (bVar3) {
        std::__cxx11::string::_M_assign((string *)local_70);
        std::__cxx11::string::substr((ulong)local_50,(ulong)normal);
        std::__cxx11::string::operator=((string *)normal,(string *)local_50);
        this_00 = (file_server *)local_50._0_8_;
        if ((file_server *)local_50._0_8_ != (file_server *)(local_50 + 0x10)) {
          operator_delete((void *)local_50._0_8_);
        }
        if (normal->_M_string_length == 0) {
          this_00 = (file_server *)normal;
          std::__cxx11::string::_M_replace((ulong)normal,0,(char *)0x0,0x24873a);
        }
        if (bVar3) break;
      }
      ppVar4 = (this->alias_).
               super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      bVar3 = uVar6 < (ulong)((long)(this->alias_).
                                    super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)ppVar4 >> 6);
      uVar5 = uVar6;
      uVar6 = (ulong)((int)uVar6 + 1);
    } while (bVar3);
  }
  if ((normal->_M_string_length == 0) || (*(normal->_M_dataplus)._M_p != '/')) {
LAB_001ec566:
    bVar3 = false;
  }
  else {
    if (this->check_symlinks_ == true) {
      bVar3 = is_in_root(this_00,normal,(string *)local_70,real);
      if (!bVar3) goto LAB_001ec566;
    }
    else {
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_50,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_70,
                     normal);
      std::__cxx11::string::operator=((string *)real,(string *)local_50);
      if ((file_server *)local_50._0_8_ != (file_server *)(local_50 + 0x10)) {
        operator_delete((void *)local_50._0_8_);
      }
      sVar2 = real->_M_string_length;
      if ((sVar2 != 0) && ((real->_M_dataplus)._M_p[sVar2 - 1] == '/')) {
        std::__cxx11::string::resize((ulong)real,(char)sVar2 + -1);
      }
    }
    bVar3 = true;
  }
  if ((undefined1 *)local_70._0_8_ != local_70 + 0x10) {
    operator_delete((void *)local_70._0_8_);
  }
  return bVar3;
}

Assistant:

bool file_server::check_in_document_root(std::string normal,std::string &real) 
{
	normalize_path(normal);
	std::string root = document_root_;
	for(unsigned i=0;i<alias_.size();i++) {
		std::string const &ref=alias_[i].first;
		if(is_file_prefix(ref,normal))
		{
			root = alias_[i].second;
			normal = normal.substr(ref.size());
			if(normal.empty())
				normal="/";
			break;
		}
	}
	if(normal.empty())
		return false;
	if(normal[0]!='/')
		return false;
	if(check_symlinks_) {
		if(!is_in_root(normal,root,real))
			return false;
	}
	else {
		real = root + normal;
        // remove trailing '/' from file name
        size_t real_size = real.size();
        if(real_size > 0 && is_directory_separator(real[real_size-1])) {
            real.resize(real_size-1);
        }
	}
	return true;
}